

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposer.cpp
# Opt level: O1

void test(int gid,ContinuousBounds *param_2,ContinuousBounds *bounds,ContinuousBounds *param_4,
         RegularContinuousLink *param_5)

{
  float fVar1;
  pointer pfVar2;
  long lVar3;
  AssertionHandler local_d0;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined **local_68;
  undefined1 local_60;
  byte local_5f;
  float *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  int local_34;
  
  local_d0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d0.m_assertionInfo.macroName.m_size = 7;
  local_d0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d0.m_assertionInfo.lineInfo.line = 0xd;
  local_d0.m_assertionInfo.capturedExpression.m_start = "gid == 0";
  local_d0.m_assertionInfo.capturedExpression.m_size = 8;
  local_d0.m_assertionInfo.resultDisposition = Normal;
  local_d0.m_reaction.shouldDebugBreak = false;
  local_d0.m_reaction.shouldThrow = false;
  local_d0.m_completed = false;
  local_34 = gid;
  local_d0.m_resultCapture = Catch::getResultCapture();
  local_40 = &local_88;
  local_88 = (ulong)local_88._4_4_ << 0x20;
  local_5f = local_34 == 0;
  local_60 = 1;
  local_68 = &PTR_streamReconstructedExpression_0019e908;
  local_50 = "==";
  local_48 = 2;
  local_58 = (float *)&local_34;
  (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
            (local_d0.m_resultCapture,&local_d0,&local_68,&local_d0.m_reaction);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  lVar3 = 0;
  do {
    local_d0.m_assertionInfo.macroName.m_start = "REQUIRE";
    local_d0.m_assertionInfo.macroName.m_size = 7;
    local_d0.m_assertionInfo.lineInfo.file =
         "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
    local_d0.m_assertionInfo.lineInfo.line = 0xf;
    local_d0.m_assertionInfo.capturedExpression.m_start = "bounds.min[i] == 0";
    local_d0.m_assertionInfo.capturedExpression.m_size = 0x12;
    local_d0.m_assertionInfo.resultDisposition = Normal;
    local_d0.m_reaction.shouldDebugBreak = false;
    local_d0.m_reaction.shouldThrow = false;
    local_d0.m_completed = false;
    local_d0.m_resultCapture = Catch::getResultCapture();
    pfVar2 = (bounds->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    local_88 = local_88 & 0xffffffff00000000;
    local_5f = *(float *)((long)pfVar2 + lVar3) == 0.0;
    local_58 = (float *)((long)pfVar2 + lVar3);
    local_60 = 1;
    local_68 = &PTR_streamReconstructedExpression_0019e948;
    local_50 = "==";
    local_48 = 2;
    local_40 = &local_88;
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
              (local_d0.m_resultCapture,&local_d0,&local_68,&local_d0.m_reaction);
    Catch::AssertionHandler::complete(&local_d0);
    if (local_d0.m_completed == false) {
      (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0xe])(local_d0.m_resultCapture,&local_d0);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  local_d0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d0.m_assertionInfo.macroName.m_size = 7;
  local_d0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d0.m_assertionInfo.lineInfo.line = 0x10;
  local_d0.m_assertionInfo.capturedExpression.m_start = "bounds.max[0] == Approx(33.333)";
  local_d0.m_assertionInfo.capturedExpression.m_size = 0x1f;
  local_d0.m_assertionInfo.resultDisposition = Normal;
  local_d0.m_reaction.shouldDebugBreak = false;
  local_d0.m_reaction.shouldThrow = false;
  local_d0.m_completed = false;
  local_d0.m_resultCapture = Catch::getResultCapture();
  local_58 = (bounds->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  local_88 = 0x3ee9000000000000;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0x4040aa9fbe76c8b4;
  local_5f = -(*local_58 <= 33.333397) & -(33.333 <= *local_58 + 0.00039736033) & 1;
  local_60 = 1;
  local_68 = &PTR_streamReconstructedExpression_0019e988;
  local_50 = "==";
  local_48 = 2;
  local_40 = &local_88;
  (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
            (local_d0.m_resultCapture,&local_d0,&local_68,&local_d0.m_reaction);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d0.m_assertionInfo.macroName.m_size = 7;
  local_d0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d0.m_assertionInfo.lineInfo.line = 0x11;
  local_d0.m_assertionInfo.capturedExpression.m_start = "bounds.max[1] == Approx(33.333)";
  local_d0.m_assertionInfo.capturedExpression.m_size = 0x1f;
  local_d0.m_assertionInfo.resultDisposition = Normal;
  local_d0.m_reaction.shouldDebugBreak = false;
  local_d0.m_reaction.shouldThrow = false;
  local_d0.m_completed = false;
  local_d0.m_resultCapture = Catch::getResultCapture();
  pfVar2 = (bounds->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  local_88 = 0x3ee9000000000000;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0x4040aa9fbe76c8b4;
  fVar1 = pfVar2[1];
  local_58 = pfVar2 + 1;
  local_5f = -(fVar1 <= 33.333397) & -(33.333 <= fVar1 + 0.00039736033) & 1;
  local_60 = 1;
  local_68 = &PTR_streamReconstructedExpression_0019e988;
  local_50 = "==";
  local_48 = 2;
  local_40 = &local_88;
  (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
            (local_d0.m_resultCapture,&local_d0,&local_68,&local_d0.m_reaction);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d0.m_assertionInfo.macroName.m_size = 7;
  local_d0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d0.m_assertionInfo.lineInfo.line = 0x12;
  local_d0.m_assertionInfo.capturedExpression.m_start = "bounds.max[2] == 100.";
  local_d0.m_assertionInfo.capturedExpression.m_size = 0x15;
  local_d0.m_assertionInfo.resultDisposition = Normal;
  local_d0.m_reaction.shouldDebugBreak = false;
  local_d0.m_reaction.shouldThrow = false;
  local_d0.m_completed = false;
  local_d0.m_resultCapture = Catch::getResultCapture();
  pfVar2 = (bounds->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  local_88 = 0x4059000000000000;
  local_58 = pfVar2 + 2;
  local_5f = pfVar2[2] == 100.0;
  local_60 = 1;
  local_68 = &PTR_streamReconstructedExpression_0019e9c8;
  local_50 = "==";
  local_48 = 2;
  local_40 = &local_88;
  (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
            (local_d0.m_resultCapture,&local_d0,&local_68,&local_d0.m_reaction);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void  test(int gid,                                         // block global id
           const diy::ContinuousBounds&,                    // block bounds without any ghost added
           const diy::ContinuousBounds& bounds,             // block bounds including ghost region
           const diy::ContinuousBounds&,                    // global data bounds
           const diy::RegularContinuousLink&)               // neighborhood
{
    REQUIRE(gid == 0);
    for (int i = 0; i < 3; ++i)
        REQUIRE(bounds.min[i] == 0);
    REQUIRE(bounds.max[0] == Approx(33.333));
    REQUIRE(bounds.max[1] == Approx(33.333));
    REQUIRE(bounds.max[2] == 100.);
}